

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetExtensionFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *file)

{
  string sStack_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,"/");
  GetFilePath_abi_cxx11_(&local_98,this,options,file);
  anon_unknown_0::ToFileName(&local_78,&local_98);
  std::operator+(&local_38,&local_58,&local_78);
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&sStack_b8,(GeneratorOptions *)this);
  std::operator+(__return_storage_ptr__,&local_38,&sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string GetExtensionFileName(const GeneratorOptions& options,
                            const FileDescriptor* file) {
  return options.output_dir + "/" + ToFileName(GetFilePath(options, file)) +
         options.GetFileNameExtension();
}